

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  string *psVar1;
  size_t sVar2;
  uint uVar3;
  uint32_t extraout_EDX;
  uint32_t code_point;
  uint32_t extraout_EDX_00;
  ulong uVar4;
  ulong uVar5;
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [376];
  string local_58;
  string *local_38;
  
  uVar3 = (uint)str;
  local_38 = __return_storage_ptr__;
  if (uVar3 == 0xffffffff) {
    sVar2 = wcslen((wchar_t *)this);
    uVar3 = (uint)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  uVar4 = 0;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = uVar4;
  }
  code_point = extraout_EDX;
  for (; (psVar1 = local_38, uVar5 != uVar4 && (*(uint *)(this + uVar4 * 4) != 0));
      uVar4 = uVar4 + 1) {
    CodePointToUtf8_abi_cxx11_(&local_58,(internal *)(ulong)*(uint *)(this + uVar4 * 4),code_point);
    std::operator<<(local_1d0,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    code_point = extraout_EDX_00;
  }
  StringStreamToString(local_38,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return psVar1;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    uint32_t unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<uint32_t>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}